

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void __thiscall Helper::GeneratePermutedVectors(Helper *this,int n_p,int n_d,int count)

{
  allocator<std::vector<long,_std::allocator<long>_>_> *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int iVar1;
  reference pvVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_01;
  reference pvVar6;
  ostream *poVar7;
  int local_8c4;
  string *local_8b0;
  int local_818;
  int local_814;
  int k_2;
  int j_2;
  int k_1;
  int j_1;
  int local_7fc;
  int local_7f8;
  int k;
  int j;
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  temp;
  undefined1 local_7d0 [8];
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  R;
  vector<int,_std::allocator<int>_> Pi;
  long temp2;
  long temp1;
  int local_788;
  int l;
  int m;
  int n;
  int i;
  allocator local_774;
  allocator local_773;
  allocator local_772;
  allocator local_771;
  string *local_770;
  string local_768 [32];
  string local_748 [32];
  string local_728 [32];
  string local_708 [32];
  string local_6e8 [32];
  string local_6c8 [32];
  string local_6a8 [32];
  string local_688 [32];
  iterator local_668;
  size_type local_660;
  undefined1 local_658 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_name;
  ifstream fin2;
  istream local_428 [8];
  ifstream fin1;
  ostream local_220 [8];
  ofstream output_file;
  int count_local;
  int n_d_local;
  int n_p_local;
  Helper *this_local;
  
  std::ofstream::ofstream(local_220);
  std::ifstream::ifstream(local_428);
  std::ifstream::ifstream
            (&file_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  n._3_1_ = 1;
  local_770 = local_768;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"../randoms/bob/Pi_diff_R_PA_PB.txt",&local_771);
  local_770 = local_748;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"../randoms/alice/Pi_diff_R_PB_PA.txt",&local_772);
  local_770 = local_728;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_728,"../randoms/bob/Pi_diff_R_DA_DB.txt",&local_773);
  local_770 = local_708;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"../randoms/alice/Pi_diff_R_DB_DA.txt",&local_774);
  local_770 = local_6e8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e8,"../randoms/alice/R_PA.txt",(allocator *)((long)&i + 3));
  local_770 = local_6c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6c8,"../randoms/bob/R_PB.txt",(allocator *)((long)&i + 2));
  local_770 = local_6a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"../randoms/alice/R_DA.txt",(allocator *)((long)&i + 1));
  local_770 = local_688;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"../randoms/bob/R_DB.txt",(allocator *)&i);
  n._3_1_ = 0;
  local_668 = (iterator)local_768;
  local_660 = 8;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&n + 2));
  __l._M_len = local_660;
  __l._M_array = local_668;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_658,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&n + 2));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&n + 2));
  local_8b0 = (string *)&local_668;
  do {
    local_8b0 = local_8b0 + -0x20;
    std::__cxx11::string::~string(local_8b0);
  } while (local_8b0 != local_768);
  std::allocator<char>::~allocator((allocator<char> *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 1));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 2));
  std::allocator<char>::~allocator((allocator<char> *)((long)&i + 3));
  std::allocator<char>::~allocator((allocator<char> *)&local_774);
  std::allocator<char>::~allocator((allocator<char> *)&local_773);
  std::allocator<char>::~allocator((allocator<char> *)&local_772);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  for (m = 0; m < 4; m = m + 1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_658,(long)m);
    std::ofstream::open(local_220,pvVar2,0x10);
    local_8c4 = n_d;
    if (m < 2) {
      local_8c4 = n_p;
    }
    l = local_8c4;
    local_788 = (uint)(m < 2) * 3 + 2;
    iVar1 = count;
    switch(m) {
    case 0:
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,4);
      std::ifstream::open(local_428,pvVar2,8);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,5);
      std::ifstream::open(&file_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar2,8);
      iVar1 = count;
      break;
    case 1:
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,5);
      std::ifstream::open(local_428,pvVar2,8);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,4);
      std::ifstream::open(&file_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar2,8);
      iVar1 = count;
      break;
    case 2:
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,6);
      std::ifstream::open(local_428,pvVar2,8);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,7);
      std::ifstream::open(&file_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar2,8);
      iVar1 = count;
      break;
    case 3:
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,7);
      std::ifstream::open(local_428,pvVar2,8);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_658,6);
      std::ifstream::open(&file_name.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar2,8);
      iVar1 = count;
    }
    while (temp1._4_4_ = iVar1, temp1._4_4_ != 0) {
      temp1._4_4_ = temp1._4_4_ + -1;
      LoadNextRandomPermutation
                ((vector<int,_std::allocator<int>_> *)
                 &R.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,this,m,l);
      sVar3 = (size_type)l;
      this_00 = (allocator<std::vector<long,_std::allocator<long>_>_> *)
                ((long)&temp.
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator(this_00);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)local_7d0,sVar3,this_00);
      std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
                ((allocator<std::vector<long,_std::allocator<long>_>_> *)
                 ((long)&temp.
                         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      sVar3 = (size_type)l;
      std::allocator<std::vector<long,_std::allocator<long>_>_>::allocator
                ((allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&k + 3));
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)&j,sVar3,(allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&k + 3));
      std::allocator<std::vector<long,_std::allocator<long>_>_>::~allocator
                ((allocator<std::vector<long,_std::allocator<long>_>_> *)((long)&k + 3));
      for (local_7f8 = 0; local_7f8 < l; local_7f8 = local_7f8 + 1) {
        for (local_7fc = 0; local_7fc < local_788; local_7fc = local_7fc + 1) {
          std::istream::operator>>(local_428,&temp2);
          std::istream::operator>>
                    ((istream *)
                     &file_name.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (long *)&Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
          pvVar4 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 *)&j,(long)local_7f8);
          _k_1 = temp2 - (long)Pi.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage;
          std::vector<long,_std::allocator<long>_>::push_back(pvVar4,(value_type_conflict1 *)&k_1);
        }
      }
      for (j_2 = 0; j_2 < l; j_2 = j_2 + 1) {
        for (k_2 = 0; k_2 < local_788; k_2 = k_2 + 1) {
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)
                              &R.
                               super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)j_2);
          pvVar4 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 *)local_7d0,(long)*pvVar5);
          this_01 = std::
                    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                  *)&j,(long)j_2);
          pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](this_01,(long)k_2);
          std::vector<long,_std::allocator<long>_>::push_back(pvVar4,pvVar6);
        }
      }
      for (local_814 = 0; local_814 < l; local_814 = local_814 + 1) {
        for (local_818 = 0; local_818 < local_788; local_818 = local_818 + 1) {
          pvVar4 = std::
                   vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                   ::operator[]((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                                 *)local_7d0,(long)local_814);
          pvVar6 = std::vector<long,_std::allocator<long>_>::operator[](pvVar4,(long)local_818);
          poVar7 = (ostream *)std::ostream::operator<<(local_220,*pvVar6);
          std::operator<<(poVar7," ");
        }
        std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
      }
      std::ostream::operator<<(local_220,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)&j);
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                 *)local_7d0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &R.
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar1 = temp1._4_4_;
    }
    temp1._4_4_ = temp1._4_4_ + -1;
    std::ifstream::close();
    std::ifstream::close();
    std::ostream::flush();
    std::ofstream::close();
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_658);
  std::ifstream::~ifstream
            (&file_name.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::ifstream::~ifstream(local_428);
  std::ofstream::~ofstream(local_220);
  return;
}

Assistant:

void Helper::GeneratePermutedVectors(int n_p, int n_d, int count)
{
    std::ofstream output_file;
    std::ifstream fin1, fin2;
    std::vector<std::string> file_name = {"../randoms/bob/Pi_diff_R_PA_PB.txt", "../randoms/alice/Pi_diff_R_PB_PA.txt",
                                          "../randoms/bob/Pi_diff_R_DA_DB.txt", "../randoms/alice/Pi_diff_R_DB_DA.txt",
                                          "../randoms/alice/R_PA.txt", "../randoms/bob/R_PB.txt", "../randoms/alice/R_DA.txt", "../randoms/bob/R_DB.txt"};
    for (int i = 0; i < 4; i++)
    {
        output_file.open(file_name[i]);
        int n = (i < 2 ? n_p : n_d);
        int m = (i < 2 ? 5 : 2);
        switch (i)
        {
        case 0:
            fin1.open(file_name[4]);
            fin2.open(file_name[5]);
            break;
        case 1:
            fin1.open(file_name[5]);
            fin2.open(file_name[4]);
            break;
        case 2:
            fin1.open(file_name[6]);
            fin2.open(file_name[7]);
            break;
        case 3:
            fin1.open(file_name[7]);
            fin2.open(file_name[6]);
            break;
        default:
            break;
        }

        int l = count;
        long temp1, temp2;
        while (l--)
        {
            std::vector<int> Pi = LoadNextRandomPermutation(i, n);
            std::vector<std::vector<long>> R(n),temp(n);
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                    fin1 >> temp1;
                    fin2 >> temp2;
                    temp[j].push_back(temp1-temp2);
                }
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                    R[Pi[j]].push_back(temp[j][k]);
                    
            }
            for (int j = 0; j < n; j++)
            {
                for (int k = 0; k < m; k++)
                {
                   output_file<<R[j][k]<<" "; 
                }
                output_file<<std::endl;
            }
            output_file<<std::endl;
        }
        fin1.close();
        fin2.close();
        output_file.flush();
        output_file.close();
    }
}